

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

char * __thiscall Assimp::ColladaParser::TestTextContent(ColladaParser *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ColladaParser *local_20;
  char *text;
  ColladaParser *this_local;
  
  text = (char *)this;
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if ((iVar1 != 1) || (uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])(), (uVar2 & 1) != 0)) {
    return (char *)0x0;
  }
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((uVar2 & 1) == 0) {
    return (char *)0x0;
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if ((iVar1 != 3) && (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])(), iVar1 != 5)) {
    return (char *)0x0;
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
  local_20 = (ColladaParser *)CONCAT44(extraout_var,iVar1);
  SkipSpacesAndLineEnd<char>((char **)&local_20);
  return (char *)local_20;
}

Assistant:

const char* ColladaParser::TestTextContent()
{
    // present node should be the beginning of an element
    if (mReader->getNodeType() != irr::io::EXN_ELEMENT || mReader->isEmptyElement())
        return NULL;

    // read contents of the element
    if (!mReader->read())
        return NULL;
    if (mReader->getNodeType() != irr::io::EXN_TEXT && mReader->getNodeType() != irr::io::EXN_CDATA)
        return NULL;

    // skip leading whitespace
    const char* text = mReader->getNodeData();
    SkipSpacesAndLineEnd(&text);

    return text;
}